

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bin.cpp
# Opt level: O3

void SolveFile(string *file)

{
  char cVar1;
  pointer pcVar2;
  long lVar3;
  string *psVar4;
  pointer pFVar5;
  pointer pCVar6;
  ostream *poVar7;
  ulong uVar8;
  long *plVar9;
  long *plVar10;
  uint uVar11;
  pointer pCVar12;
  size_type *psVar13;
  __normal_iterator<Class_*,_std::vector<Class,_std::allocator<Class>_>_> __i;
  pointer pFVar14;
  long lVar15;
  Class *pCVar16;
  long *plVar17;
  string remainingFile;
  string finalFile;
  string fileContent;
  string content;
  ClassBundle cb;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  ofstream fout;
  long *local_448;
  long local_440;
  long local_438;
  long lStack_430;
  string local_428;
  long *local_408;
  long local_400;
  long local_3f8 [2];
  string *local_3e8;
  char local_3e0;
  undefined7 uStack_3df;
  long local_3d0 [2];
  Class *local_3c0;
  Class *local_3b8;
  Class local_3b0;
  string local_330;
  ClassBundle local_310;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  Class local_2b0;
  undefined1 local_230 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  _Alloc_hider local_210;
  size_type local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  _Alloc_hider local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  vector<Field,_std::allocator<Field>_> local_1d0 [6];
  ios_base local_138 [264];
  
  local_3e8 = file;
  ReadFromFile(&local_330,file);
  EraseComments((string *)local_230,&local_330);
  std::__cxx11::string::operator=((string *)&local_330,(string *)local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._0_8_ != &local_220) {
    operator_delete((void *)local_230._0_8_,local_220._M_allocated_capacity + 1);
  }
  GetWords(&local_2c8,&local_330);
  ParseClasses(&local_310,&local_2c8);
  ClassBundle::upgradeScopes(&local_310);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"+-+-+-+-+-+-+-+-+-+-+-+-+-+\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Found the following classes\n",0x1c);
  if (local_310.allClasses.super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_310.allClasses.super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_3c0 = local_310.allClasses.super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
                super__Vector_impl_data._M_finish;
    pCVar12 = local_310.allClasses.super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      local_3b8 = pCVar12;
      Class::Class((Class *)local_230,pCVar12);
      local_448 = &local_438;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_448,local_210._M_p,local_210._M_p + local_208);
      Class::Class(&local_3b0,(Class *)local_230);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Name:\t",6);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_3b0.name._M_dataplus._M_p,
                          local_3b0.name._M_string_length);
      local_428._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_428,1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Scope:\t",7);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_3b0.scope._M_dataplus._M_p,
                          local_3b0.scope._M_string_length);
      local_428._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_428,1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"~~~~~~~\n",8);
      pFVar5 = local_3b0.fields.super__Vector_base<Field,_std::allocator<Field>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pFVar14 = local_3b0.fields.super__Vector_base<Field,_std::allocator<Field>_>._M_impl.
                     super__Vector_impl_data._M_start; pFVar14 != pFVar5; pFVar14 = pFVar14 + 1) {
        pcVar2 = (pFVar14->type)._M_dataplus._M_p;
        local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_428,pcVar2,pcVar2 + (pFVar14->type)._M_string_length);
        pcVar2 = (pFVar14->name)._M_dataplus._M_p;
        local_408 = local_3f8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_408,pcVar2,pcVar2 + (pFVar14->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_428._M_dataplus._M_p,
                            local_428._M_string_length);
        local_3e0 = '\t';
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_3e0,1);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(char *)local_408,local_400);
        local_3e0 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_3e0,1);
        if (local_408 != local_3f8) {
          operator_delete(local_408,local_3f8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428._M_dataplus._M_p != &local_428.field_2) {
          operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"<--------->\n\n\n",0xe);
      pCVar16 = local_3c0;
      std::vector<Field,_std::allocator<Field>_>::~vector(&local_3b0.fields);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0.name._M_dataplus._M_p != &local_3b0.name.field_2) {
        operator_delete(local_3b0.name._M_dataplus._M_p,
                        local_3b0.name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0.scope._M_dataplus._M_p != &local_3b0.scope.field_2) {
        operator_delete(local_3b0.scope._M_dataplus._M_p,
                        local_3b0.scope.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0.filePath._M_dataplus._M_p != &local_3b0.filePath.field_2) {
        operator_delete(local_3b0.filePath._M_dataplus._M_p,
                        local_3b0.filePath.field_2._M_allocated_capacity + 1);
      }
      if (local_448 != &local_438) {
        operator_delete(local_448,local_438 + 1);
      }
      std::vector<Field,_std::allocator<Field>_>::~vector(local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_p != &local_1e0) {
        operator_delete(local_1f0._M_p,local_1e0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_p != &local_200) {
        operator_delete(local_210._M_p,local_200._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._0_8_ != &local_220) {
        operator_delete((void *)local_230._0_8_,local_220._M_allocated_capacity + 1);
      }
      pCVar12 = local_3b8 + 1;
    } while (pCVar12 != pCVar16);
  }
  pCVar6 = local_310.allClasses.super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pCVar12 = local_310.allClasses.super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_310.allClasses.super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_310.allClasses.super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    lVar15 = (long)local_310.allClasses.super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_310.allClasses.super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
                   super__Vector_impl_data._M_start;
    uVar8 = lVar15 >> 7;
    lVar3 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Class*,std::vector<Class,std::allocator<Class>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<SolveFile(std::__cxx11::string_const&)::__0>>
              (local_310.allClasses.super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_310.allClasses.super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar15 < 0x801) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Class*,std::vector<Class,std::allocator<Class>>>,__gnu_cxx::__ops::_Iter_comp_iter<SolveFile(std::__cxx11::string_const&)::__0>>
                (pCVar12,pCVar6);
    }
    else {
      pCVar16 = pCVar12 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Class*,std::vector<Class,std::allocator<Class>>>,__gnu_cxx::__ops::_Iter_comp_iter<SolveFile(std::__cxx11::string_const&)::__0>>
                (pCVar12,pCVar16);
      for (; pCVar16 != pCVar6; pCVar16 = pCVar16 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Class*,std::vector<Class,std::allocator<Class>>>,__gnu_cxx::__ops::_Val_comp_iter<SolveFile(std::__cxx11::string_const&)::__0>>
                  (pCVar16);
      }
    }
  }
  local_3b0.filePath._M_dataplus._M_p = (pointer)&local_3b0.filePath.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"");
  psVar4 = local_3e8;
  local_230._0_8_ = &local_220;
  pcVar2 = (local_3e8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_230,pcVar2,pcVar2 + local_3e8->_M_string_length);
  uVar11 = (uint)psVar4->_M_string_length;
  if (0 < (int)uVar11) {
    uVar8 = 0;
    do {
      uVar8 = uVar8 + 1;
    } while ((uVar11 & 0x7fffffff) != uVar8);
  }
  std::__cxx11::string::substr((ulong)&local_3e0,(ulong)local_3e8);
  plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_3e0,0,(char *)0x0,0x10d2de);
  local_448 = &local_438;
  plVar10 = plVar9 + 2;
  if ((long *)*plVar9 == plVar10) {
    local_438 = *plVar10;
    lStack_430 = plVar9[3];
  }
  else {
    local_438 = *plVar10;
    local_448 = (long *)*plVar9;
  }
  local_440 = plVar9[1];
  *plVar9 = (long)plVar10;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_448);
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  psVar13 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_428.field_2._M_allocated_capacity = *psVar13;
    local_428.field_2._8_8_ = plVar9[3];
  }
  else {
    local_428.field_2._M_allocated_capacity = *psVar13;
    local_428._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_428._M_string_length = plVar9[1];
  *plVar9 = (long)psVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_3b0,(ulong)local_428._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
  }
  if (local_448 != &local_438) {
    operator_delete(local_448,local_438 + 1);
  }
  if ((long *)CONCAT71(uStack_3df,local_3e0) != local_3d0) {
    operator_delete((long *)CONCAT71(uStack_3df,local_3e0),local_3d0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._0_8_ != &local_220) {
    operator_delete((void *)local_230._0_8_,local_220._M_allocated_capacity + 1);
  }
  if (local_310.allClasses.super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_310.allClasses.super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pCVar12 = local_310.allClasses.super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      Class::Class((Class *)local_230,pCVar12);
      Class::Class(&local_2b0,(Class *)local_230);
      JSONifyClass_abi_cxx11_(&local_428,&local_2b0);
      std::__cxx11::string::_M_append((char *)&local_3b0,(ulong)local_428._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != &local_428.field_2) {
        operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
      }
      std::vector<Field,_std::allocator<Field>_>::~vector(&local_2b0.fields);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0.name._M_dataplus._M_p != &local_2b0.name.field_2) {
        operator_delete(local_2b0.name._M_dataplus._M_p,
                        local_2b0.name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0.scope._M_dataplus._M_p != &local_2b0.scope.field_2) {
        operator_delete(local_2b0.scope._M_dataplus._M_p,
                        local_2b0.scope.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0.filePath._M_dataplus._M_p != &local_2b0.filePath.field_2) {
        operator_delete(local_2b0.filePath._M_dataplus._M_p,
                        local_2b0.filePath.field_2._M_allocated_capacity + 1);
      }
      std::vector<Field,_std::allocator<Field>_>::~vector(local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_p != &local_1e0) {
        operator_delete(local_1f0._M_p,local_1e0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_p != &local_200) {
        operator_delete(local_210._M_p,local_200._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._0_8_ != &local_220) {
        operator_delete((void *)local_230._0_8_,local_220._M_allocated_capacity + 1);
      }
      pCVar12 = pCVar12 + 1;
    } while (pCVar12 !=
             local_310.allClasses.super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  pcVar2 = (local_3e8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_428,pcVar2,pcVar2 + local_3e8->_M_string_length);
  local_448 = &local_438;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"");
  do {
    if (local_428._M_string_length == 0) break;
    std::__cxx11::string::push_back((char)&local_448);
    cVar1 = local_428._M_dataplus._M_p[local_428._M_string_length - 1];
    std::__cxx11::string::pop_back();
  } while (cVar1 != '.');
  std::__cxx11::string::append((char *)&local_428);
  plVar10 = (long *)((long)local_448 + local_440 + -1);
  plVar9 = local_448;
  if (local_448 < plVar10 && local_440 != 0) {
    do {
      plVar17 = (long *)((long)plVar9 + 1);
      lVar3 = *plVar9;
      *(char *)plVar9 = (char)*plVar10;
      *(char *)plVar10 = (char)lVar3;
      plVar10 = (long *)((long)plVar10 + -1);
      plVar9 = plVar17;
    } while (plVar17 < plVar10);
  }
  std::__cxx11::string::_M_append((char *)&local_428,(ulong)local_448);
  std::ofstream::ofstream(local_230,(string *)&local_428,_S_out);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_230,local_3b0.filePath._M_dataplus._M_p,
                      local_3b0.filePath._M_string_length);
  local_3e0 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_3e0,1);
  std::ofstream::close();
  local_230._0_8_ = _VTT;
  *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = __filebuf;
  std::filebuf::~filebuf((filebuf *)(local_230 + 8));
  std::ios_base::~ios_base(local_138);
  if (local_448 != &local_438) {
    operator_delete(local_448,local_438 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0.filePath._M_dataplus._M_p != &local_3b0.filePath.field_2) {
    operator_delete(local_3b0.filePath._M_dataplus._M_p,
                    local_3b0.filePath.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_310.unknownClasses._M_t);
  std::vector<Class,_std::allocator<Class>_>::~vector(&local_310.allClasses);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SolveFile(const string& file) {
    auto content = ReadFromFile(file);
/*
    cerr << "~~~~~~~~~~~~~~~~~~~~~~\n";
    cerr << EraseComments(content) << '\n';
    cerr << "~~~~~~~~~~~~~~~~~~~~~~\n";
    cerr << "\n\n\n\n\n\n\n";
*/
    content = EraseComments(content);
    auto words = GetWords(content);
    ClassBundle cb = ParseClasses(words);

    cb.upgradeScopes();

    cout << "+-+-+-+-+-+-+-+-+-+-+-+-+-+\n";
    cout << "Found the following classes\n";
    for (auto itr : cb.allClasses) {
        auto scope = itr.scope;
        auto cls = itr;
        cout << "Name:\t" << cls.name << '\n';
        cout << "Scope:\t" << cls.scope << '\n';
        cout << "~~~~~~~\n";
        for (auto itr : cls.fields) {
            cout << "\t" << itr.type << '\t' << itr.name << '\n';
        }
        cout << "<--------->\n\n\n";
    }

    sort(cb.allClasses.begin(), cb.allClasses.end(), [](const auto& a, const auto& b) { return a.scope.size() > b.scope.size(); });
    string fileContent = "";

    {
        std::string shortFile = file;
        int start = 0;

        for (int i = 0; i < (int)file.size(); i += 1) {
            if (file[i] == '/') {
                start = i;
            }
        }

        fileContent += "#include \"" + file.substr(start, file.size()) + "\"\n"
                        "#include <JSON>\n\n";
    }

    for (auto itr : cb.allClasses) {
        fileContent += JSONifyClass(itr);
    }

    string finalFile = file;
    string remainingFile = "";

    while (finalFile.size()) {
        remainingFile += finalFile.back();
        if (finalFile.back() == '.') {
            finalFile.pop_back();
            break;
        }

        finalFile.pop_back();
    }

    finalFile += "JSONImpl";
    reverse(remainingFile.begin(), remainingFile.end());
    finalFile += remainingFile;

    ofstream fout(finalFile);
    fout << fileContent << '\n';
    fout.close();
}